

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_swap(BIGNUM *a,BIGNUM *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong *puVar6;
  int tmp_neg;
  int tmp_dmax;
  int tmp_top;
  unsigned_long *tmp_d;
  int flags_old_b;
  int flags_old_a;
  BIGNUM *b_local;
  BIGNUM *a_local;
  
  uVar1 = a->flags;
  uVar2 = b->flags;
  puVar6 = a->d;
  iVar3 = a->top;
  iVar4 = a->dmax;
  iVar5 = a->neg;
  a->d = b->d;
  a->top = b->top;
  a->dmax = b->dmax;
  a->neg = b->neg;
  b->d = puVar6;
  b->top = iVar3;
  b->dmax = iVar4;
  b->neg = iVar5;
  a->flags = uVar1 & 1 | uVar2 & 2;
  b->flags = uVar2 & 1 | uVar1 & 2;
  return;
}

Assistant:

void BN_swap(BIGNUM *a, BIGNUM *b)
{
    int flags_old_a, flags_old_b;
    BN_ULONG *tmp_d;
    int tmp_top, tmp_dmax, tmp_neg;

    bn_check_top(a);
    bn_check_top(b);

    flags_old_a = a->flags;
    flags_old_b = b->flags;

    tmp_d = a->d;
    tmp_top = a->top;
    tmp_dmax = a->dmax;
    tmp_neg = a->neg;

    a->d = b->d;
    a->top = b->top;
    a->dmax = b->dmax;
    a->neg = b->neg;

    b->d = tmp_d;
    b->top = tmp_top;
    b->dmax = tmp_dmax;
    b->neg = tmp_neg;

    a->flags =
        (flags_old_a & BN_FLG_MALLOCED) | (flags_old_b & BN_FLG_STATIC_DATA);
    b->flags =
        (flags_old_b & BN_FLG_MALLOCED) | (flags_old_a & BN_FLG_STATIC_DATA);
    bn_check_top(a);
    bn_check_top(b);
}